

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wxcli.hpp
# Opt level: O0

string * __thiscall
ws::Cli::get_media_id(string *__return_storage_ptr__,Cli *this,string *path,bool no_retry)

{
  allocator<httplib::MultipartFormData> *this_00;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_01;
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<httplib::MultipartFormData> __l_00;
  bool bVar1;
  Error EVar2;
  streambuf *psVar3;
  Response *pRVar4;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar5;
  Error error;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_c68;
  MultipartFormData *local_c48;
  byte local_be2;
  string local_bc8;
  undefined **local_ba8;
  FormatWithLoc local_ba0;
  string local_b78;
  int local_b54;
  undefined1 local_b50 [4];
  int errcode;
  undefined1 local_b30 [8];
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  json;
  FormatWithLoc local_af8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ad0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_ab0;
  undefined1 local_a90 [8];
  Result res;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a40;
  undefined1 local_a00 [24];
  Headers headers;
  path local_9b8;
  path local_990;
  allocator<char> local_961;
  string *local_960;
  undefined1 local_958 [128];
  undefined1 local_8d8 [24];
  MultipartFormDataItems items;
  string local_8a8;
  undefined1 local_888 [8];
  SSLClient cli;
  stringstream file_ss;
  undefined1 local_458 [376];
  undefined **local_2e0;
  FormatWithLoc local_2d8;
  fpos<__mbstate_t> local_2b0;
  ulong local_2a0;
  size_t file_size;
  FormatWithLoc local_290;
  path local_258;
  long local_230;
  ifstream file;
  bool no_retry_local;
  string *path_local;
  Cli *this_local;
  
  bVar1 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                    (&this->access_token);
  if (bVar1) {
    get_access_token(this);
  }
  std::ifstream::ifstream(&local_230,(string *)path,_S_bin);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_258,path,auto_format);
  bVar1 = std::filesystem::exists(&local_258);
  local_be2 = 1;
  if (bVar1) {
    local_be2 = std::ios::good();
    local_be2 = local_be2 ^ 0xff;
  }
  std::filesystem::__cxx11::path::~path(&local_258);
  if ((local_be2 & 1) != 0) {
    file_size = (size_t)&PTR_s__workspace_llm4binary_github_lic_002775f0;
    FormatWithLoc::FormatWithLoc(&local_290,(string *)no_fmt_abi_cxx11_,(source_location)0x2775f0);
    critical<char_const(&)[14]>(&local_290,(char (*) [14])"No such file.");
    FormatWithLoc::~FormatWithLoc(&local_290);
  }
  std::numeric_limits<long>::max();
  std::istream::ignore((long)&local_230);
  local_2a0 = std::istream::gcount();
  std::ios::clear((long)&local_230 + *(long *)(local_230 + -0x18),0);
  std::fpos<__mbstate_t>::fpos(&local_2b0,0);
  std::istream::seekg(&local_230,local_2b0._M_off,local_2b0._M_state);
  if (0x1400000 < local_2a0) {
    local_2e0 = &PTR_s__workspace_llm4binary_github_lic_00277608;
    FormatWithLoc::FormatWithLoc(&local_2d8,(string *)no_fmt_abi_cxx11_,(source_location)0x277608);
    critical<char_const(&)[21]>(&local_2d8,(char (*) [21])"The file is too big.");
    FormatWithLoc::~FormatWithLoc(&local_2d8);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&cli.verify_result_);
  psVar3 = (streambuf *)std::ifstream::rdbuf();
  std::ostream::operator<<(local_458,psVar3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_8a8,"qyapi.weixin.qq.com",
             (allocator<char> *)
             ((long)&items.
                     super__Vector_base<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  httplib::SSLClient::SSLClient((SSLClient *)local_888,&local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&items.
                     super__Vector_base<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 1;
  local_960 = (string *)local_958;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_958,"media",&local_961);
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = 1;
  std::__cxx11::stringstream::str();
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 1;
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_9b8,path,auto_format);
  std::filesystem::__cxx11::path::filename(&local_990,&local_9b8);
  std::filesystem::__cxx11::path::string((string *)(local_958 + 0x40),&local_990);
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(local_958 + 0x60),"application/octet-stream",
             (allocator<char> *)
             ((long)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._6_1_ = 0;
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._5_1_ = 0;
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._4_1_ = 0;
  headers._M_t._M_impl.super__Rb_tree_header._M_node_count._3_1_ = 0;
  local_8d8._0_8_ = local_958;
  local_8d8._8_8_ = 1;
  this_00 = (allocator<httplib::MultipartFormData> *)
            ((long)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count + 2);
  std::allocator<httplib::MultipartFormData>::allocator(this_00);
  __l_00._M_len = local_8d8._8_8_;
  __l_00._M_array = (iterator)local_8d8._0_8_;
  std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::vector
            ((vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_> *)
             (local_8d8 + 0x10),__l_00,this_00);
  std::allocator<httplib::MultipartFormData>::~allocator
            ((allocator<httplib::MultipartFormData> *)
             ((long)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count + 2));
  local_c48 = (MultipartFormData *)local_8d8;
  do {
    local_c48 = local_c48 + -1;
    httplib::MultipartFormData::~MultipartFormData(local_c48);
  } while (local_c48 != (MultipartFormData *)local_958);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&headers._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::filesystem::__cxx11::path::~path(&local_990);
  std::filesystem::__cxx11::path::~path(&local_9b8);
  std::allocator<char>::~allocator(&local_961);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[13],_const_char_(&)[20],_true>
            (&local_a40,(char (*) [13])"Content-Type",(char (*) [20])"multipart/form-data");
  local_a00._0_8_ = &local_a40;
  local_a00._8_8_ = 1;
  this_01 = (allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)((long)&res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count + 6);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::allocator(this_01);
  __l._M_len = local_a00._8_8_;
  __l._M_array = (iterator)local_a00._0_8_;
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)(local_a00 + 0x10),__l,
             (ci *)((long)&res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count + 7
                   ),this_01);
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~allocator((allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&res.request_headers_._M_t._M_impl.super__Rb_tree_header._M_node_count + 6)
              );
  local_c68 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)local_a00;
  do {
    local_c68 = local_c68 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair(local_c68);
  } while (local_c68 != &local_a40);
  std::operator+(&local_ad0,"/cgi-bin/media/upload?access_token=",&this->access_token);
  std::operator+(&local_ab0,&local_ad0,"&type=file");
  httplib::ClientImpl::Post
            ((Result *)local_a90,(ClientImpl *)local_888,&local_ab0,(Headers *)(local_a00 + 0x10),
             (MultipartFormDataItems *)(local_8d8 + 0x10));
  std::__cxx11::string::~string((string *)&local_ab0);
  std::__cxx11::string::~string((string *)&local_ad0);
  bVar1 = httplib::Result::operator==((Result *)local_a90,(nullptr_t)0x0);
  if ((bVar1) || (pRVar4 = httplib::Result::operator->((Result *)local_a90), pRVar4->status != 200))
  {
    FormatWithLoc::FormatWithLoc(&local_af8,(string *)no_fmt_abi_cxx11_,(source_location)0x277620);
    EVar2 = httplib::Result::error((Result *)local_a90);
    httplib::to_string_abi_cxx11_((string *)&json.m_data.m_value,(httplib *)(ulong)EVar2,error);
    critical<char_const(&)[25],char_const(&)[8],std::__cxx11::string>
              (&local_af8,(char (*) [25])"Get access token failed.",(char (*) [8])"Error: ",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &json.m_data.m_value);
    std::__cxx11::string::~string((string *)&json.m_data.m_value.boolean);
    FormatWithLoc::~FormatWithLoc(&local_af8);
  }
  pRVar4 = httplib::Result::operator->((Result *)local_a90);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)local_b50,(nullptr_t)0x0);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              *)local_b30,&pRVar4->body,
             (function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
              *)local_b50,true,false);
  std::
  function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
  ::~function((function<bool_(int,_nlohmann::json_abi_v3_11_2::detail::parse_event_t,_nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>_&)>
               *)local_b50);
  pbVar5 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_2::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)local_b30,"errcode");
  local_b54 = nlohmann::json_abi_v3_11_2::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::get<int,int>(pbVar5);
  if (local_b54 != 0) {
    if ((((local_b54 != 0xa029) && (local_b54 != 0xa411)) && (local_b54 != 0x9c4e)) || (no_retry)) {
      local_ba8 = &PTR_s__workspace_llm4binary_github_lic_00277638;
      FormatWithLoc::FormatWithLoc(&local_ba0,(string *)no_fmt_abi_cxx11_,(source_location)0x277638)
      ;
      std::__cxx11::to_string(&local_bc8,local_b54);
      pRVar4 = httplib::Result::operator->((Result *)local_a90);
      critical<char_const(&)[21],char_const(&)[10],std::__cxx11::string,char_const(&)[7],std::__cxx11::string&,char_const(&)[8],std::__cxx11::string_const&>
                (&local_ba0,(char (*) [21])"Get media id failed.",(char (*) [10])0x205635,&local_bc8
                 ,(char (*) [7])",res: ",&pRVar4->body,(char (*) [8])",path: ",path);
      std::__cxx11::string::~string((string *)&local_bc8);
      FormatWithLoc::~FormatWithLoc(&local_ba0);
    }
    else {
      get_access_token(this);
      get_media_id(&local_b78,this,path,true);
      std::__cxx11::string::~string((string *)&local_b78);
    }
  }
  pbVar5 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            *)nlohmann::json_abi_v3_11_2::
              basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              ::operator[]<char_const>
                        ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                          *)local_b30,"media_id");
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  ::get<std::__cxx11::string,std::__cxx11::string>(__return_storage_ptr__,pbVar5);
  nlohmann::json_abi_v3_11_2::
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
  ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                 *)local_b30);
  httplib::Result::~Result((Result *)local_a90);
  std::
  multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~multimap((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)(local_a00 + 0x10));
  std::vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_>::~vector
            ((vector<httplib::MultipartFormData,_std::allocator<httplib::MultipartFormData>_> *)
             (local_8d8 + 0x10));
  httplib::SSLClient::~SSLClient((SSLClient *)local_888);
  std::__cxx11::stringstream::~stringstream((stringstream *)&cli.verify_result_);
  std::ifstream::~ifstream(&local_230);
  return __return_storage_ptr__;
}

Assistant:

std::string get_media_id(const std::string &path, bool no_retry = false)
    {
      if (access_token.empty()) get_access_token();
      std::ifstream file{path, std::ios::binary};
      if (!std::filesystem::exists(path) || !file.good())
      {
        critical(no_fmt, "No such file.");
      }
    
      file.ignore((std::numeric_limits<std::streamsize>::max)());
      size_t file_size = file.gcount();
      file.clear();
      file.seekg(std::ios_base::beg);
      if (file_size > 20 * 1024 * 1024)
      {
        critical(no_fmt, "The file is too big.");
      }
      
      std::stringstream file_ss;
      file_ss << file.rdbuf();
      
      httplib::SSLClient cli("qyapi.weixin.qq.com");
      httplib::MultipartFormDataItems items
          {
              httplib::MultipartFormData
                  {"media", file_ss.str(), std::filesystem::path(path).filename().string(), "application/octet-stream"}
          };
      httplib::Headers headers
          {
              {"Content-Type", "multipart/form-data"}
          };
      auto res = cli.Post("/cgi-bin/media/upload?access_token=" + access_token + "&type=file", headers, items);
      if (res == nullptr || res->status != 200)
      {
        critical(no_fmt, "Get access token failed.", "Error: ", httplib::to_string(res.error()));
      }
      
      auto json = nlohmann::json::parse(res->body);
      if (auto errcode = json["errcode"].get<int>(); errcode != 0)
      {
        if ((errcode == 41001 || errcode == 42001 || errcode == 40014) && !no_retry)
        {
          get_access_token();
          get_media_id(path, true);
        }
        else
        {
          critical(no_fmt,
                   "Get media id failed.",
                   "errcode: ", std::to_string(errcode), ",res: ", res->body, ",path: ", path);
        }
      }
      return json["media_id"].get<std::string>();
    }